

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O1

DdNode * cuddBddLICBuildResult(DdManager *dd,DdNode *f,st__table *cache,st__table *table)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *E;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *T;
  int *piVar6;
  uint uVar7;
  DdNode *r;
  int markings;
  DdNode *local_58;
  uint local_50;
  int local_4c;
  DdNode *local_48;
  uint local_3c;
  DdNode *local_38;
  
  piVar6 = (int *)((ulong)f & 0xfffffffffffffffe);
  if (*piVar6 == 0x7fffffff) {
    return f;
  }
  E = dd->one;
  iVar2 = st__lookup(cache,(char *)piVar6,(char **)&local_58);
  if (iVar2 != 0) {
    return (DdNode *)((ulong)((uint)f & 1) ^ (ulong)local_58);
  }
  iVar2 = st__lookup_int(table,(char *)piVar6,(int *)&local_3c);
  if (iVar2 == 0) {
    return (DdNode *)0x0;
  }
  pDVar5 = (DdNode *)((ulong)E ^ 1);
  local_4c = *piVar6;
  pDVar4 = *(DdNode **)(piVar6 + 6);
  pDVar3 = E;
  if (((int)local_3c >> 2 != 1) && (pDVar3 = pDVar5, (int)local_3c >> 2 == 3)) {
    local_50 = local_3c;
    local_48 = pDVar5;
    local_38 = pDVar4;
    pDVar3 = cuddBddLICBuildResult(dd,*(DdNode **)(piVar6 + 4),cache,table);
    pDVar4 = local_38;
    pDVar5 = local_48;
    local_3c = local_50;
    if (pDVar3 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
  }
  uVar7 = local_3c & 3;
  T = (DdNode *)((ulong)pDVar3 & 0xfffffffffffffffe);
  T->ref = T->ref + 1;
  if (((uVar7 != 1) && (E = pDVar5, uVar7 == 3)) &&
     (local_50 = local_3c, local_48 = pDVar3, E = cuddBddLICBuildResult(dd,pDVar4,cache,table),
     pDVar3 = local_48, local_3c = local_50, E == (DdNode *)0x0)) goto LAB_007d0c4c;
  piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  local_58 = E;
  if ((uVar7 == 0 || 3 < local_3c) && (local_58 = pDVar3, uVar7 != 0 || local_3c < 4)) {
    if (((ulong)pDVar3 & 1) == 0) {
      if (pDVar3 != E) {
        local_58 = cuddUniqueInter(dd,local_4c,pDVar3,E);
      }
      if (local_58 == (DdNode *)0x0) {
LAB_007d0cf4:
        Cudd_IterDerefBdd(dd,E);
        goto LAB_007d0c4c;
      }
    }
    else {
      E = (DdNode *)((ulong)E ^ 1);
      pDVar4 = T;
      if (T != E) {
        pDVar4 = cuddUniqueInter(dd,local_4c,T,E);
      }
      pDVar3 = T;
      if (pDVar4 == (DdNode *)0x0) {
        local_58 = (DdNode *)0x0;
        goto LAB_007d0cf4;
      }
      local_58 = (DdNode *)((ulong)pDVar4 ^ 1);
    }
  }
  piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  iVar2 = st__insert(cache,(char *)piVar6,(char *)local_58);
  if (iVar2 != -10000) {
    return (DdNode *)((ulong)((uint)f & 1) ^ (ulong)local_58);
  }
  piVar6 = (int *)(((ulong)local_58 & 0xfffffffffffffffe) + 4);
  *piVar6 = *piVar6 + 1;
  pDVar3 = local_58;
LAB_007d0c4c:
  Cudd_IterDerefBdd(dd,pDVar3);
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
cuddBddLICBuildResult(
  DdManager * dd,
  DdNode * f,
  st__table * cache,
  st__table * table)
{
    DdNode *Fv, *Fnv, *r, *t, *e;
    DdNode *one, *zero;
    int index;
    int comple;
    int markT, markE, markings;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    if (Cudd_IsConstant(f)) return(f);
    /* Make canonical to increase the utilization of the cache. */
    comple = Cudd_IsComplement(f);
    f = Cudd_Regular(f);

    /* Check the cache. */
    if ( st__lookup(cache, (const char *)f, (char **)&r)) {
        return(Cudd_NotCond(r,comple));
    }

    /* Retrieve the edge markings. */
    if ( st__lookup_int(table, (char *)f, &markings) == 0)
        return(NULL);
    markT = markings >> 2;
    markE = markings & 3;

    index = f->index;
    Fv = cuddT(f); Fnv = cuddE(f);

    if (markT == DD_LIC_NL) {
        t = cuddBddLICBuildResult(dd,Fv,cache,table);
        if (t == NULL) {
            return(NULL);
        }
    } else if (markT == DD_LIC_1) {
        t = one;
    } else {
        t = zero;
    }
    cuddRef(t);
    if (markE == DD_LIC_NL) {
        e = cuddBddLICBuildResult(dd,Fnv,cache,table);
        if (e == NULL) {
            Cudd_IterDerefBdd(dd,t);
            return(NULL);
        }
    } else if (markE == DD_LIC_1) {
        e = one;
    } else {
        e = zero;
    }
    cuddRef(e);

    if (markT == DD_LIC_DC && markE != DD_LIC_DC) {
        r = e;
    } else if (markT != DD_LIC_DC && markE == DD_LIC_DC) {
        r = t;
    } else {
        if (Cudd_IsComplement(t)) {
            t = Cudd_Not(t);
            e = Cudd_Not(e);
            r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
            if (r == NULL) {
                Cudd_IterDerefBdd(dd, e);
                Cudd_IterDerefBdd(dd, t);
                return(NULL);
            }
        }
    }
    cuddDeref(t);
    cuddDeref(e);

    if ( st__insert(cache, (char *)f, (char *)r) == st__OUT_OF_MEM) {
        cuddRef(r);
        Cudd_IterDerefBdd(dd,r);
        return(NULL);
    }

    return(Cudd_NotCond(r,comple));

}